

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.h
# Opt level: O1

void __thiscall BailOutRecord::ArgOutOffsetInfo::Fixup(ArgOutOffsetInfo *this,DataChunk *chunkList)

{
  NativeCodeData::AddFixupEntry(this->argOutFloat64Syms,this,this,chunkList);
  NativeCodeData::AddFixupEntry
            (this->argOutLosslessInt32Syms,&this->argOutLosslessInt32Syms,this,chunkList);
  NativeCodeData::AddFixupEntry
            (this->startCallOutParamCounts,
             this->startCallOutParamCounts + -(ulong)this->startCallIndex,
             &this->startCallOutParamCounts,this,chunkList);
  NativeCodeData::AddFixupEntry
            (this->outParamOffsets,this->outParamOffsets + -(ulong)this->argOutSymStart,
             &this->outParamOffsets,this,chunkList);
  return;
}

Assistant:

void Fixup(NativeCodeData::DataChunk* chunkList)
        {
            FixupNativeDataPointer(argOutFloat64Syms, chunkList);
            FixupNativeDataPointer(argOutLosslessInt32Syms, chunkList);
#ifdef _M_IX86
            FixupNativeDataPointer(isOrphanedArgSlot, chunkList);
#endif
            // special handling for startCallOutParamCounts and outParamOffsets, becuase it points to middle of the allocation
            uint* startCallOutParamCountsStart = startCallOutParamCounts - startCallIndex;
            NativeCodeData::AddFixupEntry(startCallOutParamCounts, startCallOutParamCountsStart, &this->startCallOutParamCounts, this, chunkList);

            int* outParamOffsetsStart = outParamOffsets - argOutSymStart;
            NativeCodeData::AddFixupEntry(outParamOffsets, outParamOffsetsStart, &this->outParamOffsets, this, chunkList);

        }